

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::reset_peer_info(raft_server *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  ulong index;
  element_type *peVar6;
  shared_ptr<nuraft::buffer> *args_1;
  log_val_type *args_2;
  unsigned_long *args_3;
  element_type *peVar7;
  long in_RDI;
  ptr<log_entry> entry;
  ptr<buffer> new_conf_buf;
  ptr<cluster_config> my_next_config;
  ptr<srv_config> my_srv_config;
  size_type srv_cnt;
  ptr<cluster_config> c_config;
  cluster_config *in_stack_fffffffffffffe78;
  cluster_config *in_stack_fffffffffffffe80;
  ptr<cluster_config> *in_stack_fffffffffffffe88;
  raft_server *in_stack_fffffffffffffe90;
  raft_server *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffeb0;
  cluster_config *in_stack_fffffffffffffeb8;
  ptr<log_entry> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  cluster_config *in_stack_ffffffffffffff18;
  string local_c8 [32];
  ulong local_a8;
  ulong local_a0;
  int local_84;
  string local_80 [32];
  __shared_ptr local_60 [16];
  string local_50 [48];
  size_type local_20;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  get_config(in_stack_fffffffffffffe98);
  peVar4 = std::
           __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x24c228);
  cluster_config::get_servers_abi_cxx11_(peVar4);
  local_20 = std::__cxx11::
             list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
             ::size((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                     *)in_stack_fffffffffffffe80);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x24c27a);
    iVar2 = (*peVar5->_vptr_logger[7])();
    if (4 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24c2aa);
      msg_if_given_abi_cxx11_((char *)local_50,"servers: %zu\n",local_20);
      (*peVar5->_vptr_logger[8])
                (peVar5,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"reset_peer_info",0x2ed,local_50);
      std::__cxx11::string::~string(local_50);
    }
  }
  if (1 < local_20) {
    std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x24c36a);
    cluster_config::get_server(in_stack_fffffffffffffeb8,iVar3);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_60);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x24c4ad);
      index = cluster_config::get_log_idx(peVar4);
      local_a0 = index;
      peVar4 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x24c4d6);
      local_a8 = cluster_config::get_prev_log_idx(peVar4);
      cs_new<nuraft::cluster_config,unsigned_long,unsigned_long>
                ((unsigned_long *)in_stack_fffffffffffffe88,&in_stack_fffffffffffffe80->log_idx_);
      peVar4 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x24c51e);
      cluster_config::get_servers_abi_cxx11_(peVar4);
      std::__cxx11::
      list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ::push_back((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                   *)in_stack_fffffffffffffe90,(value_type *)in_stack_fffffffffffffe88);
      std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x24c54e);
      std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x24c560);
      cluster_config::get_user_ctx_abi_cxx11_(in_stack_fffffffffffffe78);
      cluster_config::set_user_ctx(in_stack_fffffffffffffe80,(string *)in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(local_c8);
      peVar4 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x24c5a0);
      peVar6 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x24c5b2);
      bVar1 = cluster_config::is_async_replication(peVar6);
      cluster_config::set_async_replication(peVar4,bVar1);
      set_config(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x24c5fb);
      args_1 = (shared_ptr<nuraft::buffer> *)
               std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x24c603);
      peVar6 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)in_stack_fffffffffffffe80);
      (**(_func_int **)
         ((args_1->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 0x18))
                (args_1,peVar6);
      std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x24c635);
      cluster_config::serialize(in_stack_ffffffffffffff18);
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x24c658);
      args_2 = (log_val_type *)srv_state::get_term((srv_state *)0x24c660);
      args_3 = (unsigned_long *)timer_helper::get_timeofday_us();
      cs_new<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
                (&peVar4->log_idx_,args_1,args_2,args_3);
      peVar7 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x24c6d5);
      (*peVar7->_vptr_log_store[2])();
      store_log_entry((raft_server *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      in_stack_fffffffffffffec8,index);
      std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x24c70f);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x24c71c);
      std::shared_ptr<nuraft::cluster_config>::~shared_ptr
                ((shared_ptr<nuraft::cluster_config> *)0x24c729);
      local_84 = 0;
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x24c3c4);
        iVar3 = (*peVar5->_vptr_logger[7])();
        if (2 < iVar3) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x24c3f4);
          msg_if_given_abi_cxx11_((char *)local_80,"my_srv_config is NULL");
          (*peVar5->_vptr_logger[8])
                    (peVar5,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"reset_peer_info",0x2f4,local_80);
          std::__cxx11::string::~string(local_80);
        }
      }
      local_84 = 1;
    }
    std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x24c741);
    if (local_84 != 0) goto LAB_0024c7fb;
  }
  local_84 = 0;
LAB_0024c7fb:
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x24c808);
  return;
}

Assistant:

void raft_server::reset_peer_info() {
    ptr<cluster_config> c_config = get_config();
    auto const srv_cnt = c_config->get_servers().size();
    p_db("servers: %zu\n", srv_cnt);
    if (srv_cnt > 1) {
        ptr<srv_config> my_srv_config = c_config->get_server(id_);
        if (!my_srv_config) {
            // It means that this node was removed, and then
            // added again (it shouldn't happen though).
            // Just return.
            p_wn("my_srv_config is NULL");
            return;
        }

        ptr<cluster_config> my_next_config = cs_new<cluster_config>
            ( c_config->get_log_idx(), c_config->get_prev_log_idx() );
        my_next_config->get_servers().push_back(my_srv_config);
        my_next_config->set_user_ctx( c_config->get_user_ctx() );
        my_next_config->set_async_replication
                        ( c_config->is_async_replication() );

        set_config(my_next_config);
        ctx_->state_mgr_->save_config(*my_next_config);

        // Make its local temporary log for configuration.
        // It will be rolled back and overwritten if this node
        // re-joins the cluster.
        ptr<buffer> new_conf_buf(my_next_config->serialize());
        ptr<log_entry> entry(cs_new<log_entry>(
            state_->get_term(), new_conf_buf, log_val_type::conf,
            timer_helper::get_timeofday_us()));
        store_log_entry(entry, log_store_->next_slot()-1);
    }
}